

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress1X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  DTableDesc DVar1;
  size_t sVar2;
  size_t in_RCX;
  void *in_RDX;
  HUF_DTable *in_R8;
  undefined4 in_R9D;
  DTableDesc dtd;
  HUF_DTable *in_stack_ffffffffffffffc8;
  
  DVar1 = HUF_getDTableDesc(in_R8);
  if (DVar1.tableType == '\0') {
    sVar2 = HUF_decompress1X1_usingDTable_internal
                      (in_RDX,in_RCX,in_R8,CONCAT44(in_R9D,DVar1),in_stack_ffffffffffffffc8,0);
  }
  else {
    sVar2 = HUF_decompress1X2_usingDTable_internal
                      (in_RDX,in_RCX,in_R8,CONCAT44(in_R9D,DVar1),in_stack_ffffffffffffffc8,0);
  }
  return sVar2;
}

Assistant:

size_t HUF_decompress1X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress1X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress1X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}